

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfunction.h
# Opt level: O2

void __thiscall
TPZDummyFunction<double>::TPZDummyFunction
          (TPZDummyFunction<double> *this,_func_void_TPZVec<double>_ptr_TPZVec<double>_ptr *FuncPtr,
          int polynomialorder)

{
  this->super_TPZFunction<double> = (TPZFunction<double>)&PTR__TPZDummyFunction_01647358;
  this->fFunc = FuncPtr;
  this->fFunc2 = (_func_void_TPZVec<double>_ptr_TPZVec<double>_ptr_TPZFMatrix<double>_ptr *)0x0;
  this->fFunc3 = (_func_void_TPZVec<double>_ptr_REAL_TPZVec<double>_ptr_TPZFMatrix<double>_ptr *)0x0
  ;
  this->fPorder = polynomialorder;
  return;
}

Assistant:

TPZDummyFunction(void (*FuncPtr)(const TPZVec<REAL> &x, TPZVec<TVar> &val), int polynomialorder )
    : TPZRegisterClassId(&TPZDummyFunction::ClassId)
    {
        fFunc = FuncPtr;
		fFunc2 = 0;
		fFunc3 = 0;
		fPorder = polynomialorder;
    }